

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O3

void edition_unittest::TestFieldOrderings::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  ulong uVar1;
  undefined8 *puVar2;
  void *pvVar3;
  Arena *arena;
  char *extraout_RDX;
  char *pcVar4;
  uint unaff_EBP;
  MessageLite *pMVar5;
  MessageLite *pMVar6;
  Arena *arena_00;
  string_view value;
  
  arena = (Arena *)(to_msg->_internal_metadata_).ptr_;
  arena_00 = arena;
  if (((ulong)arena & 1) != 0) {
    arena_00 = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  if (from_msg == to_msg) {
    pMVar5 = to_msg;
    pMVar6 = from_msg;
    MergeImpl();
    pcVar4 = extraout_RDX;
LAB_00c3138f:
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
LAB_00c312d3:
    value._M_str = pcVar4;
    value._M_len = (size_t)pMVar5;
    google::protobuf::internal::ArenaStringPtr::Set((ArenaStringPtr *)pMVar6,value,arena);
  }
  else {
    unaff_EBP = (uint)from_msg[2]._internal_metadata_.ptr_;
    if ((unaff_EBP & 0xf) == 0) goto LAB_00c31326;
    if ((unaff_EBP & 1) != 0) {
      puVar2 = (undefined8 *)((ulong)from_msg[3]._vptr_MessageLite & 0xfffffffffffffffc);
      pcVar4 = (char *)*puVar2;
      pMVar5 = (MessageLite *)puVar2[1];
      *(uint *)&to_msg[2]._internal_metadata_.ptr_ = (uint)to_msg[2]._internal_metadata_.ptr_ | 1;
      pMVar6 = to_msg + 3;
      if (((ulong)arena & 1) != 0) goto LAB_00c3138f;
      goto LAB_00c312d3;
    }
  }
  if ((unaff_EBP & 2) != 0) {
    pMVar6 = (MessageLite *)from_msg[3]._internal_metadata_.ptr_;
    if (pMVar6 == (MessageLite *)0x0) {
      MergeImpl((TestFieldOrderings *)&stack0xffffffffffffffd0);
    }
    pMVar5 = (MessageLite *)to_msg[3]._internal_metadata_.ptr_;
    if (pMVar5 == (MessageLite *)0x0) {
      pvVar3 = google::protobuf::Arena::
               CopyConstruct<edition_unittest::TestFieldOrderings_NestedMessage>(arena_00,pMVar6);
      to_msg[3]._internal_metadata_.ptr_ = (intptr_t)pvVar3;
    }
    else {
      TestFieldOrderings_NestedMessage::MergeImpl(pMVar5,pMVar6);
    }
  }
  if ((unaff_EBP & 4) != 0) {
    to_msg[4]._vptr_MessageLite = from_msg[4]._vptr_MessageLite;
  }
  if ((unaff_EBP & 8) != 0) {
    *(int *)&to_msg[4]._internal_metadata_.ptr_ = (int)from_msg[4]._internal_metadata_.ptr_;
  }
LAB_00c31326:
  *(uint *)&to_msg[2]._internal_metadata_.ptr_ =
       (uint)to_msg[2]._internal_metadata_.ptr_ | unaff_EBP;
  google::protobuf::internal::ExtensionSet::MergeFrom
            ((ExtensionSet *)(to_msg + 1),(MessageLite *)_TestFieldOrderings_default_instance_,
             (ExtensionSet *)(from_msg + 1));
  uVar1 = (from_msg->_internal_metadata_).ptr_;
  if ((uVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
              (&to_msg->_internal_metadata_,(UnknownFieldSet *)((uVar1 & 0xfffffffffffffffe) + 8));
    return;
  }
  return;
}

Assistant:

void TestFieldOrderings::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestFieldOrderings*>(&to_msg);
  auto& from = static_cast<const TestFieldOrderings&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:edition_unittest.TestFieldOrderings)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x0000000fu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _this->_internal_set_my_string(from._internal_my_string());
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      ABSL_DCHECK(from._impl_.optional_nested_message_ != nullptr);
      if (_this->_impl_.optional_nested_message_ == nullptr) {
        _this->_impl_.optional_nested_message_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.optional_nested_message_);
      } else {
        _this->_impl_.optional_nested_message_->MergeFrom(*from._impl_.optional_nested_message_);
      }
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _this->_impl_.my_int_ = from._impl_.my_int_;
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      _this->_impl_.my_float_ = from._impl_.my_float_;
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_impl_._extensions_.MergeFrom(&default_instance(), from._impl_._extensions_);
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}